

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O0

_Bool container_iterate(container_t *c,uint8_t type,uint32_t base,roaring_iterator iterator,
                       void *ptr)

{
  _Bool _Var1;
  container_t *pcVar2;
  void *in_RCX;
  undefined4 in_EDX;
  undefined1 in_SIL;
  container_t *in_RDI;
  roaring_iterator in_R8;
  undefined4 in_stack_ffffffffffffffd0;
  uint32_t base_00;
  undefined3 in_stack_ffffffffffffffec;
  undefined4 uVar3;
  uint8_t uVar4;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  uVar3 = CONCAT13(in_SIL,in_stack_ffffffffffffffec);
  pcVar2 = container_unwrap_shared(in_RDI,&stack0xffffffffffffffef);
  uVar4 = (uint8_t)((uint)uVar3 >> 0x18);
  if (uVar4 == '\x01') {
    _Var1 = bitset_container_iterate
                      ((bitset_container_t *)
                       CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                       (uint32_t)((ulong)pcVar2 >> 0x20),(roaring_iterator)CONCAT44(uVar3,in_EDX),
                       in_RCX);
  }
  else {
    base_00 = (uint32_t)((ulong)in_RCX >> 0x20);
    if (uVar4 == '\x02') {
      _Var1 = array_container_iterate
                        ((array_container_t *)CONCAT44(uVar3,in_EDX),base_00,in_R8,
                         (void *)(ulong)CONCAT14(2,in_stack_ffffffffffffffd0));
    }
    else {
      _Var1 = run_container_iterate
                        ((run_container_t *)CONCAT44(uVar3,in_EDX),base_00,in_R8,
                         (void *)(ulong)CONCAT14(uVar4,in_stack_ffffffffffffffd0));
    }
  }
  return _Var1;
}

Assistant:

static inline bool container_iterate(const container_t *c, uint8_t type,
                                     uint32_t base, roaring_iterator iterator,
                                     void *ptr) {
    c = container_unwrap_shared(c, &type);
    switch (type) {
        case BITSET_CONTAINER_TYPE:
            return bitset_container_iterate(const_CAST_bitset(c), base,
                                            iterator, ptr);
        case ARRAY_CONTAINER_TYPE:
            return array_container_iterate(const_CAST_array(c), base, iterator,
                                           ptr);
        case RUN_CONTAINER_TYPE:
            return run_container_iterate(const_CAST_run(c), base, iterator,
                                         ptr);
        default:
            assert(false);
            roaring_unreachable;
    }
    assert(false);
    roaring_unreachable;
    return false;
}